

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateInit2_(z_streamp strm,int level,int method,int windowBits,int memLevel,int strategy,
                 char *version,int stream_size)

{
  long *plVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ushf *overlay;
  int in_stack_00000010;
  int wrap;
  deflate_state *s;
  z_streamp in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  int local_1c;
  int local_14;
  int local_4;
  
  uVar3 = 1;
  if (((overlay == (ushf *)0x0) || ((char)*overlay != '1')) || (in_stack_00000010 != 0x70)) {
    local_4 = -6;
  }
  else if (in_RDI == 0) {
    local_4 = -2;
  }
  else {
    *(undefined8 *)(in_RDI + 0x30) = 0;
    if (*(long *)(in_RDI + 0x40) == 0) {
      *(code **)(in_RDI + 0x40) = zcalloc;
      *(undefined8 *)(in_RDI + 0x50) = 0;
    }
    if (*(long *)(in_RDI + 0x48) == 0) {
      *(code **)(in_RDI + 0x48) = zcfree;
    }
    local_14 = in_ESI;
    if (in_ESI == -1) {
      local_14 = 6;
    }
    if (in_ECX < 0) {
      uVar3 = 0;
      local_1c = -in_ECX;
    }
    else {
      local_1c = in_ECX;
      if (0xf < in_ECX) {
        uVar3 = 2;
        local_1c = in_ECX + -0x10;
      }
    }
    if (((((in_R8D < 1) || (9 < in_R8D)) || ((in_EDX != 8 || ((local_1c < 8 || (0xf < local_1c))))))
        || (local_14 < 0)) || (((9 < local_14 || (in_R9D < 0)) || (4 < in_R9D)))) {
      local_4 = -2;
    }
    else {
      if (local_1c == 8) {
        local_1c = 9;
      }
      plVar1 = (long *)(**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x50),1,0x1728);
      if (plVar1 == (long *)0x0) {
        local_4 = -4;
      }
      else {
        *(long **)(in_RDI + 0x38) = plVar1;
        *plVar1 = in_RDI;
        *(undefined4 *)((long)plVar1 + 0x2c) = uVar3;
        plVar1[6] = 0;
        *(int *)(plVar1 + 9) = local_1c;
        *(int *)((long)plVar1 + 0x44) = 1 << ((byte)(int)plVar1[9] & 0x1f);
        *(int *)((long)plVar1 + 0x4c) = *(int *)((long)plVar1 + 0x44) + -1;
        *(int *)(plVar1 + 0xf) = in_R8D + 7;
        *(int *)((long)plVar1 + 0x74) = 1 << ((byte)(int)plVar1[0xf] & 0x1f);
        *(int *)((long)plVar1 + 0x7c) = *(int *)((long)plVar1 + 0x74) + -1;
        *(uint *)(plVar1 + 0x10) = ((int)plVar1[0xf] + 2U) / 3;
        lVar2 = (**(code **)(in_RDI + 0x40))
                          (*(undefined8 *)(in_RDI + 0x50),*(undefined4 *)((long)plVar1 + 0x44),2);
        plVar1[10] = lVar2;
        lVar2 = (**(code **)(in_RDI + 0x40))
                          (*(undefined8 *)(in_RDI + 0x50),*(undefined4 *)((long)plVar1 + 0x44),2);
        plVar1[0xc] = lVar2;
        lVar2 = (**(code **)(in_RDI + 0x40))
                          (*(undefined8 *)(in_RDI + 0x50),*(undefined4 *)((long)plVar1 + 0x74),2);
        plVar1[0xd] = lVar2;
        *(int *)(plVar1 + 0x2df) = 1 << ((char)in_R8D + 6U & 0x1f);
        lVar2 = (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x50),(int)plVar1[0x2df],4);
        plVar1[2] = lVar2;
        plVar1[3] = (ulong)*(uint *)(plVar1 + 0x2df) << 2;
        if (((plVar1[10] == 0) || (plVar1[0xc] == 0)) || ((plVar1[0xd] == 0 || (plVar1[2] == 0)))) {
          *(undefined4 *)(plVar1 + 1) = 0x29a;
          *(char **)(in_RDI + 0x30) = "insufficient memory";
          deflateEnd(in_stack_ffffffffffffffb8);
          local_4 = -4;
        }
        else {
          plVar1[0x2e0] = lVar2 + (ulong)(*(uint *)(plVar1 + 0x2df) >> 1) * 2;
          plVar1[0x2de] = plVar1[2] + (ulong)*(uint *)(plVar1 + 0x2df) * 3;
          *(int *)((long)plVar1 + 0xb4) = local_14;
          *(int *)(plVar1 + 0x17) = in_R9D;
          *(undefined1 *)((long)plVar1 + 0x3c) = 8;
          local_4 = deflateReset((z_streamp)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ZEXPORT deflateInit2_(strm, level, method, windowBits, memLevel, strategy,
                  version, stream_size)
    z_streamp strm;
    int  level;
    int  method;
    int  windowBits;
    int  memLevel;
    int  strategy;
    const char *version;
    int stream_size;
{
    deflate_state *s;
    int wrap = 1;
    static const char my_version[] = ZLIB_VERSION;

    ushf *overlay;
    /* We overlay pending_buf and d_buf+l_buf. This works since the average
     * output size for (length,distance) codes is <= 24 bits.
     */

    if (version == Z_NULL || version[0] != my_version[0] ||
        stream_size != sizeof(z_stream)) {
        return Z_VERSION_ERROR;
    }
    if (strm == Z_NULL) return Z_STREAM_ERROR;

    strm->msg = Z_NULL;
    if (strm->zalloc == (alloc_func)0) {
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
    }
    if (strm->zfree == (free_func)0) strm->zfree = zcfree;

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif

    if (windowBits < 0) { /* suppress zlib wrapper */
        wrap = 0;
        windowBits = -windowBits;
    }
#ifdef GZIP
    else if (windowBits > 15) {
        wrap = 2;       /* write gzip wrapper instead */
        windowBits -= 16;
    }
#endif
    if (memLevel < 1 || memLevel > MAX_MEM_LEVEL || method != Z_DEFLATED ||
        windowBits < 8 || windowBits > 15 || level < 0 || level > 9 ||
        strategy < 0 || strategy > Z_FIXED) {
        return Z_STREAM_ERROR;
    }
    if (windowBits == 8) windowBits = 9;  /* until 256-byte window bug fixed */
    s = (deflate_state *) ZALLOC(strm, 1, sizeof(deflate_state));
    if (s == Z_NULL) return Z_MEM_ERROR;
    strm->state = (struct internal_state FAR *)s;
    s->strm = strm;

    s->wrap = wrap;
    s->gzhead = Z_NULL;
    s->w_bits = windowBits;
    s->w_size = 1 << s->w_bits;
    s->w_mask = s->w_size - 1;

    s->hash_bits = memLevel + 7;
    s->hash_size = 1 << s->hash_bits;
    s->hash_mask = s->hash_size - 1;
    s->hash_shift =  ((s->hash_bits+MIN_MATCH-1)/MIN_MATCH);

    s->window = (Bytef *) ZALLOC(strm, s->w_size, 2*sizeof(Byte));
    s->prev   = (Posf *)  ZALLOC(strm, s->w_size, sizeof(Pos));
    s->head   = (Posf *)  ZALLOC(strm, s->hash_size, sizeof(Pos));

    s->lit_bufsize = 1 << (memLevel + 6); /* 16K elements by default */

    overlay = (ushf *) ZALLOC(strm, s->lit_bufsize, sizeof(ush)+2);
    s->pending_buf = (uchf *) overlay;
    s->pending_buf_size = (ulg)s->lit_bufsize * (sizeof(ush)+2L);

    if (s->window == Z_NULL || s->prev == Z_NULL || s->head == Z_NULL ||
        s->pending_buf == Z_NULL) {
        s->status = FINISH_STATE;
        strm->msg = (char*)ERR_MSG(Z_MEM_ERROR);
        deflateEnd (strm);
        return Z_MEM_ERROR;
    }
    s->d_buf = overlay + s->lit_bufsize/sizeof(ush);
    s->l_buf = s->pending_buf + (1+sizeof(ush))*s->lit_bufsize;

    s->level = level;
    s->strategy = strategy;
    s->method = (Byte)method;

    return deflateReset(strm);
}